

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testdict.c
# Opt level: O1

int main(void)

{
  size_t __n;
  bool bVar1;
  undefined1 auVar2 [16];
  undefined4 uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  xmlChar **ppxVar7;
  xmlChar *pxVar8;
  long lVar9;
  xmlChar *extraout_RAX;
  xmlChar *pxVar10;
  xmlHashTablePtr hash;
  StringPool *pool;
  xmlChar **ppxVar11;
  StringPool *pool_00;
  xmlChar xVar12;
  int extraout_EDX;
  uint uVar13;
  ulong uVar14;
  char **ppcVar15;
  xmlChar *pxVar16;
  int i;
  long lVar17;
  size_t sVar18;
  uint uVar19;
  char **ppcVar20;
  long lVar21;
  ulong uVar22;
  bool bVar23;
  xmlChar prefix [40];
  int iStack_e8;
  undefined8 uStack_e0;
  char *local_58 [5];
  
  xmlCheckVersion(0x5398);
  strings1 = (xmlChar **)(*_xmlMalloc)(800000);
  lVar9 = 0;
  memset(strings1,0,800000);
  strings2 = (xmlChar **)(*_xmlMalloc)(800000);
  memset(strings2,0,800000);
  test1 = (xmlChar **)(*_xmlMalloc)(800000);
  memset(test1,0,800000);
  test2 = (xmlChar **)(*_xmlMalloc)(800000);
  memset(test2,0,800000);
  fill_string_pool(strings1,seeds1);
  ppcVar15 = seeds2;
  ppxVar11 = strings2;
  fill_string_pool(strings2,seeds2);
  ppxVar7 = (xmlChar **)xmlDictCreate();
  if (ppxVar7 == (xmlChar **)0x0) {
    main_cold_22();
  }
  else {
    *test1 = (xmlChar *)0x0;
    lVar17 = 0;
    do {
      pxVar8 = (xmlChar *)xmlDictLookup(ppxVar7,strings1[lVar17],0xffffffff);
      test1[lVar17] = pxVar8;
      if (pxVar8 == (xmlChar *)0x0) {
        main_cold_1();
        lVar9 = 1;
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 != 10);
    lVar17 = 90000;
    do {
      pxVar8 = strings1[lVar17];
      uVar3 = xmlStrlen(pxVar8);
      pxVar8 = (xmlChar *)xmlDictLookup(ppxVar7,pxVar8,uVar3);
      test1[lVar17] = pxVar8;
      if (pxVar8 == (xmlChar *)0x0) {
        main_cold_2();
        lVar9 = 1;
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 != 0x15f9a);
    lVar17 = 0x18696;
    do {
      pxVar8 = strings1[lVar17];
      uVar3 = xmlStrlen(pxVar8);
      pxVar8 = (xmlChar *)xmlDictLookup(ppxVar7,pxVar8,uVar3);
      test1[lVar17] = pxVar8;
      if (pxVar8 == (xmlChar *)0x0) {
        main_cold_3();
        lVar9 = 1;
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 != 100000);
    lVar17 = 0;
    do {
      if (test1[lVar17] == (xmlChar *)0x0) {
        pxVar8 = (xmlChar *)xmlDictLookup(ppxVar7,strings1[lVar17],0xffffffff);
        test1[lVar17] = pxVar8;
        if (pxVar8 == (xmlChar *)0x0) {
          main_cold_4();
          lVar9 = 1;
        }
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 != 100000);
    lVar17 = 0;
    do {
      iVar4 = xmlDictOwns(ppxVar7,test1[lVar17]);
      if (iVar4 == 0) {
        main_cold_5();
        lVar9 = 1;
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 != 100000);
    lVar17 = 0;
    do {
      pxVar8 = (xmlChar *)xmlDictLookup(ppxVar7,strings1[lVar17],0xffffffff);
      if (pxVar8 != test1[lVar17]) {
        main_cold_6();
        lVar9 = 1;
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 != 100000);
    lVar17 = 90000;
    do {
      pxVar8 = strings1[lVar17];
      xVar12 = *pxVar8;
      ppcVar15 = local_58;
      while (xVar12 != ':') {
        *(xmlChar *)ppcVar15 = xVar12;
        ppcVar15 = (char **)((long)ppcVar15 + 1);
        pxVar16 = pxVar8 + 1;
        pxVar8 = pxVar8 + 1;
        xVar12 = *pxVar16;
      }
      ppcVar20 = (char **)(pxVar8 + 1);
      *(undefined1 *)ppcVar15 = 0;
      ppcVar15 = local_58;
      pxVar8 = (xmlChar *)xmlDictQLookup(ppxVar7,local_58,ppcVar20);
      if (pxVar8 != test1[lVar17]) {
        main_cold_7();
        lVar9 = 1;
        ppcVar15 = ppcVar20;
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 != 100000);
    ppxVar11 = ppxVar7;
    lVar17 = xmlDictCreateSub();
    if (lVar17 != 0) {
      *test2 = (xmlChar *)0x0;
      lVar21 = 0;
      bVar23 = false;
      do {
        pxVar8 = (xmlChar *)xmlDictLookup(lVar17,strings2[lVar21],0xffffffff);
        test2[lVar21] = pxVar8;
        if (pxVar8 == (xmlChar *)0x0) {
          main_cold_8();
          bVar23 = true;
        }
        lVar21 = lVar21 + 1;
      } while (lVar21 != 10);
      lVar21 = 90000;
      do {
        pxVar8 = strings2[lVar21];
        uVar3 = xmlStrlen(pxVar8);
        pxVar8 = (xmlChar *)xmlDictLookup(lVar17,pxVar8,uVar3);
        test2[lVar21] = pxVar8;
        if (pxVar8 == (xmlChar *)0x0) {
          main_cold_9();
          bVar23 = true;
        }
        lVar21 = lVar21 + 1;
      } while (lVar21 != 0x15f9a);
      lVar21 = 0x18696;
      do {
        pxVar8 = strings2[lVar21];
        uVar3 = xmlStrlen(pxVar8);
        pxVar8 = (xmlChar *)xmlDictLookup(lVar17,pxVar8,uVar3);
        test2[lVar21] = pxVar8;
        if (pxVar8 == (xmlChar *)0x0) {
          main_cold_10();
          bVar23 = true;
        }
        lVar21 = lVar21 + 1;
      } while (lVar21 != 100000);
      lVar21 = 0;
      do {
        if (test2[lVar21] == (xmlChar *)0x0) {
          pxVar8 = (xmlChar *)xmlDictLookup(lVar17,strings2[lVar21],0xffffffff);
          test2[lVar21] = pxVar8;
          if (pxVar8 == (xmlChar *)0x0) {
            main_cold_11();
            bVar23 = true;
          }
        }
        lVar21 = lVar21 + 1;
      } while (lVar21 != 100000);
      lVar21 = 0;
      do {
        iVar4 = xmlDictOwns(lVar17,test2[lVar21]);
        if (iVar4 == 0) {
          main_cold_12();
          bVar23 = true;
        }
        iVar4 = xmlDictOwns(ppxVar7,test2[lVar21]);
        if (iVar4 != 0) {
          main_cold_13();
          bVar23 = true;
        }
        lVar21 = lVar21 + 1;
      } while (lVar21 != 100000);
      lVar21 = 0;
      do {
        iVar4 = xmlDictOwns(lVar17,test1[lVar21]);
        if (iVar4 == 0) {
          main_cold_14();
          bVar23 = true;
        }
        lVar21 = lVar21 + 1;
      } while (lVar21 != 100000);
      lVar21 = 0;
      do {
        pxVar8 = (xmlChar *)xmlDictLookup(lVar17,strings2[lVar21],0xffffffff);
        if (pxVar8 != test2[lVar21]) {
          main_cold_15();
          bVar23 = true;
        }
        lVar21 = lVar21 + 1;
      } while (lVar21 != 100000);
      lVar21 = 0;
      do {
        pxVar8 = (xmlChar *)xmlDictLookup(lVar17,strings1[lVar21],0xffffffff);
        if (pxVar8 != test1[lVar21]) {
          main_cold_16();
          bVar23 = true;
        }
        lVar21 = lVar21 + 1;
      } while (lVar21 != 100000);
      lVar21 = 90000;
      do {
        pxVar8 = strings2[lVar21];
        xVar12 = *pxVar8;
        ppcVar15 = local_58;
        while (xVar12 != ':') {
          *(xmlChar *)ppcVar15 = xVar12;
          ppcVar15 = (char **)((long)ppcVar15 + 1);
          pxVar16 = pxVar8 + 1;
          pxVar8 = pxVar8 + 1;
          xVar12 = *pxVar16;
        }
        *(xmlChar *)ppcVar15 = '\0';
        pxVar8 = (xmlChar *)xmlDictQLookup(lVar17,local_58,pxVar8 + 1);
        if (pxVar8 != test2[lVar21]) {
          main_cold_17();
          bVar23 = true;
        }
        lVar21 = lVar21 + 1;
      } while (lVar21 != 100000);
      lVar21 = 90000;
      do {
        pxVar8 = strings1[lVar21];
        xVar12 = *pxVar8;
        ppcVar15 = local_58;
        while (xVar12 != ':') {
          *(xmlChar *)ppcVar15 = xVar12;
          ppcVar15 = (char **)((long)ppcVar15 + 1);
          pxVar16 = pxVar8 + 1;
          pxVar8 = pxVar8 + 1;
          xVar12 = *pxVar16;
        }
        *(xmlChar *)ppcVar15 = '\0';
        xmlDictQLookup(lVar17,local_58,pxVar8 + 1);
        pxVar8 = (xmlChar *)xmlDictQLookup(lVar17,local_58,pxVar8 + 1);
        if (pxVar8 != test1[lVar21]) {
          main_cold_18();
          bVar23 = true;
        }
        lVar21 = lVar21 + 1;
      } while (lVar21 != 100000);
      xmlDictFree(lVar17);
      xmlDictFree(ppxVar7);
      lVar17 = 0;
      do {
        if (strings1[lVar17] != (xmlChar *)0x0) {
          (*_xmlFree)();
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 != 100000);
      lVar17 = 0;
      do {
        if (strings2[lVar17] != (xmlChar *)0x0) {
          (*_xmlFree)();
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 != 100000);
      (*_xmlFree)(strings1);
      (*_xmlFree)(strings2);
      (*_xmlFree)(test1);
      (*_xmlFree)(test2);
      bVar23 = bVar23 || (int)lVar9 != 0;
      if (bVar23) {
        main_cold_19();
      }
      uVar6 = (uint)bVar23;
      sVar18 = 1;
      do {
        uVar14 = 1000;
        if (sVar18 == 1) {
          uVar14 = 100000;
        }
        uVar22 = 10;
        do {
          auVar2._8_8_ = 0;
          auVar2._0_8_ = uVar22;
          lVar9 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(1000)) / auVar2,0);
          if (1000 < uVar22) {
            lVar9 = 1;
          }
          for (; lVar9 != 0; lVar9 = lVar9 + -1) {
            iVar4 = test_hash(uVar22,sVar18,0);
            if (iVar4 != 0) goto LAB_00103049;
          }
          iVar4 = test_hash(uVar22,sVar18,1);
          if (iVar4 != 0) {
LAB_00103049:
            main_cold_20();
            uVar6 = 1;
            goto LAB_00103053;
          }
          uVar22 = uVar22 * 10;
        } while (uVar22 <= uVar14);
        sVar18 = sVar18 + 1;
        if (sVar18 == 4) {
LAB_00103053:
          xmlCleanupParser();
          return uVar6;
        }
      } while( true );
    }
  }
  main_cold_21();
  if (*ppcVar15 == (char *)0x0) {
    ppxVar7 = (xmlChar **)0x0;
    pxVar8 = extraout_RAX;
  }
  else {
    ppxVar7 = (xmlChar **)0x0;
    do {
      pxVar8 = (xmlChar *)xmlStrdup();
      ppxVar11[(long)ppxVar7] = pxVar8;
      if (pxVar8 == (xmlChar *)0x0) {
        fill_string_pool_cold_1();
        goto LAB_0010322b;
      }
      lVar17 = (long)ppxVar7 + 1;
      ppxVar7 = (xmlChar **)((long)ppxVar7 + 1);
    } while (ppcVar15[lVar17] != (char *)0x0);
  }
  uVar6 = (uint)pxVar8;
  if ((uint)ppxVar7 < 90000) {
    uVar14 = (ulong)ppxVar7 & 0xffffffff;
    ppxVar7 = (xmlChar **)0x0;
    iVar4 = 0;
    do {
      lVar9 = (long)iVar4;
      pxVar8 = (xmlChar *)xmlStrncatNew(ppxVar11[lVar9],ppxVar11[(long)ppxVar7],0xffffffff);
      ppxVar11[uVar14] = pxVar8;
      if (pxVar8 == (xmlChar *)0x0) goto LAB_00103230;
      iVar5 = xmlStrlen(pxVar8);
      if (0x1e < iVar5) goto LAB_00103235;
      bVar23 = 0x30 < iVar4;
      bVar1 = 0x30 < iVar4;
      iVar4 = iVar4 + 1;
      if (bVar1) {
        iVar4 = 0;
      }
      uVar6 = (uint)bVar23 + (int)ppxVar7;
      ppxVar7 = (xmlChar **)(ulong)uVar6;
      uVar14 = uVar14 + 1;
    } while (uVar14 != 90000);
    ppxVar7 = (xmlChar **)0x15f90;
  }
  uVar19 = (uint)ppxVar7;
  if (uVar19 < 100000) {
    ppxVar7 = ppxVar11 + ((ulong)ppxVar7 & 0xffffffff);
    uVar14 = 499;
    if ((ulong)(99999 - uVar19) < 499) {
      uVar14 = (ulong)(99999 - uVar19);
    }
    lVar9 = uVar14 + 1;
    lVar17 = 0;
    uVar6 = 0;
    do {
      pxVar8 = (xmlChar *)xmlStrncatNew(ppxVar11[(int)uVar6],":",0xffffffff);
      ppxVar7[lVar17] = pxVar8;
      if (pxVar8 == (xmlChar *)0x0) {
LAB_0010322b:
        fill_string_pool_cold_3();
LAB_00103230:
        fill_string_pool_cold_4();
LAB_00103235:
        fprintf(_stderr,"### %s %s\n",ppxVar11[lVar9 + 90000],ppxVar11[(long)ppxVar7]);
        abort();
      }
      bVar23 = 0x15f8e < (int)uVar6;
      uVar6 = uVar6 + 1;
      if (bVar23) {
        uVar6 = 0;
      }
      lVar17 = lVar17 + 1;
    } while ((int)lVar9 != (int)lVar17);
    uVar19 = uVar19 + (int)lVar17;
  }
  if (uVar19 < 100000) {
    uVar14 = (ulong)uVar19;
    iVar4 = 0;
    uVar6 = 0;
    do {
      pxVar8 = ppxVar11[(long)(int)uVar6 + 90000];
      pxVar16 = ppxVar11[iVar4];
      pxVar10 = (xmlChar *)xmlStrncatNew(pxVar8,pxVar16,0xffffffff);
      ppxVar11[uVar14] = pxVar10;
      if (pxVar10 == (xmlChar *)0x0) {
        fill_string_pool_cold_2();
        if (extraout_EDX == 0) {
          uStack_e0 = 0;
          hash = (xmlHashTablePtr)xmlHashCreate(0);
        }
        else {
          uStack_e0 = xmlDictCreate();
          hash = (xmlHashTablePtr)xmlHashCreateDict(0);
        }
        pool = (StringPool *)(*_xmlMalloc)(0x30);
        pool->num_entries = (size_t)pxVar8;
        pool->num_keys = (size_t)pxVar16;
        sVar18 = (long)pxVar16 * (long)pxVar8;
        __n = sVar18 * 8;
        ppxVar11 = (xmlChar **)(*_xmlMalloc)(__n);
        pool->strings = ppxVar11;
        memset(ppxVar11,0,__n);
        pool->num_strings = sVar18;
        pool->index = 0;
        pool->id = '1';
        pool_00 = (StringPool *)(*_xmlMalloc)(0x30);
        pool_00->num_entries = (size_t)pxVar8;
        pool_00->num_keys = (size_t)pxVar16;
        ppxVar11 = (xmlChar **)(*_xmlMalloc)(__n);
        pool_00->strings = ppxVar11;
        memset(ppxVar11,0,__n);
        pool_00->num_strings = sVar18;
        iStack_e8 = 0;
        pool_00->index = 0;
        pool_00->id = '2';
        if (sVar18 != 0) {
          iStack_e8 = 0;
          do {
            uVar6 = rng_state_0 * -0x61c88645;
            uVar13 = rng_state_0 * -0x3910c8a0;
            uVar19 = rng_state_1 ^ rng_state_0;
            rng_state_0 = uVar19 << 9 ^ (rng_state_0 << 0x1a | rng_state_0 >> 6) ^ uVar19;
            rng_state_1 = uVar19 << 0xd | uVar19 >> 0x13;
            iVar4 = pool_bulk_insert(pool,hash,(ulong)(((uVar6 >> 0x1b | uVar13) * 5) % 0x32));
            if (iVar4 != 0) {
              test_hash_cold_1();
              iStack_e8 = 1;
            }
            uVar6 = rng_state_0 * -0x61c88645;
            uVar13 = rng_state_0 * -0x3910c8a0;
            uVar19 = rng_state_1 ^ rng_state_0;
            rng_state_0 = uVar19 << 9 ^ (rng_state_0 << 0x1a | rng_state_0 >> 6) ^ uVar19;
            rng_state_1 = uVar19 << 0xd | uVar19 >> 0x13;
            iVar4 = pool_bulk_insert(pool_00,hash,(ulong)(((uVar6 >> 0x1b | uVar13) * 5) % 100));
            if (iVar4 != 0) {
              test_hash_cold_2();
              iStack_e8 = 1;
            }
          } while (pool_00->index < pool_00->num_strings);
        }
        pool_00->index = 0;
        iVar4 = pool_bulk_lookup(pool_00,hash,pool_00->num_entries,1);
        if (iVar4 != 0) {
          test_hash_cold_3();
          iStack_e8 = 1;
        }
        pool_00->index = 0;
        while ((pool->index < pool->num_strings || (pool_00->index < pool_00->num_strings))) {
          uVar6 = rng_state_0 * -0x61c88645;
          uVar13 = rng_state_0 * -0x3910c8a0;
          uVar19 = rng_state_1 ^ rng_state_0;
          rng_state_0 = uVar19 << 9 ^ (rng_state_0 << 0x1a | rng_state_0 >> 6) ^ uVar19;
          rng_state_1 = uVar19 << 0xd | uVar19 >> 0x13;
          iVar4 = pool_bulk_insert(pool,hash,(ulong)(((uVar6 >> 0x1b | uVar13) * 5) % 0x32));
          if (iVar4 != 0) {
            test_hash_cold_6();
            iStack_e8 = 1;
          }
          uVar6 = rng_state_1 ^ rng_state_0;
          uVar19 = uVar6 << 9 ^ (rng_state_0 << 0x1a | rng_state_0 >> 6) ^ uVar6;
          rng_state_1 = uVar6 << 0xd | uVar6 >> 0x13;
          uVar14 = pool_00->index;
          if ((uVar14 < pool_00->num_strings) &&
             (uVar6 = ((rng_state_0 * -0x61c88645 >> 0x1b | rng_state_0 * -0x3910c8a0) * 5) % 100,
             uVar6 != 0)) {
            uVar13 = 0;
            uVar22 = 1;
            rng_state_0 = uVar19;
            do {
              ppxVar11 = pool_00->strings;
              sVar18 = pool_00->num_keys;
              if (sVar18 == 3) {
                iVar4 = xmlHashRemoveEntry3(hash,ppxVar11[uVar14],ppxVar11[uVar14 + 1],
                                            ppxVar11[uVar14 + 2],0);
              }
              else if (sVar18 == 2) {
                iVar4 = xmlHashRemoveEntry2(hash,ppxVar11[uVar14],ppxVar11[uVar14 + 1],0);
              }
              else {
                iVar4 = -1;
                if (sVar18 == 1) {
                  iVar4 = xmlHashRemoveEntry(hash,ppxVar11[uVar14],0);
                }
              }
              uVar13 = uVar13 | -(uint)(iVar4 != 0);
              uVar14 = uVar14 + pool_00->num_keys;
            } while ((uVar14 < pool_00->num_strings) &&
                    (bVar23 = uVar22 < uVar6, uVar22 = uVar22 + 1, bVar23));
            pool_00->index = uVar14;
            if (uVar13 != 0) {
              test_hash_cold_7();
              iStack_e8 = 1;
            }
          }
          else {
            rng_state_0 = uVar19;
            pool_00->index = uVar14;
          }
        }
        pool->index = 0;
        iVar4 = pool_bulk_lookup(pool,hash,pool->num_entries,1);
        if (iVar4 != 0) {
          test_hash_cold_4();
          iStack_e8 = 1;
        }
        pool_00->index = 0;
        iVar4 = pool_bulk_lookup(pool_00,hash,pool_00->num_entries,0);
        if (iVar4 != 0) {
          test_hash_cold_5();
          iStack_e8 = 1;
        }
        pool_free(pool);
        pool_free(pool_00);
        xmlHashFree(hash,0);
        xmlDictFree(uStack_e0);
        return iStack_e8;
      }
      bVar23 = 0x1f2 < (int)uVar6;
      uVar6 = uVar6 + 1;
      if (bVar23) {
        uVar6 = 0;
      }
      bVar23 = 0x15f8a < iVar4;
      iVar4 = iVar4 + 5;
      if (bVar23) {
        iVar4 = 0;
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != 100000);
  }
  return uVar6;
}

Assistant:

int
main(void) {
    int ret = 0;

    LIBXML_TEST_VERSION

    if (testall_dict() != 0) {
        fprintf(stderr, "dictionary tests failed\n");
        ret = 1;
    }
    if (testall_hash() != 0) {
        fprintf(stderr, "hash tests failed\n");
        ret = 1;
    }

    xmlCleanupParser();
    return(ret);
}